

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<false>::tryme<1u,3u,4u,4u,3u,3u>(uint32_t *n,size_t len)

{
  ulong local_40;
  uint local_38;
  uint local_34;
  uint32_t i_2;
  uint32_t min3;
  uint32_t i_1;
  uint32_t min2;
  uint32_t i;
  uint32_t min1;
  size_t len_local;
  uint32_t *n_local;
  
  local_34 = (uint)(len != 0);
  for (i = 0; i < local_34; i = i + 1) {
    if (7 < n[i]) {
      return false;
    }
  }
  local_40 = len - local_34;
  if (local_40 < 4) {
    local_38 = (uint)local_40;
  }
  else {
    local_38 = 4;
  }
  for (i_1 = local_34; i_1 < local_34 + local_38; i_1 = i_1 + 1) {
    if (0xf < n[i_1]) {
      return false;
    }
  }
  local_40 = local_40 - local_38;
  if (2 < local_40) {
    local_40 = 3;
  }
  i_2 = local_34 + local_38;
  while( true ) {
    if (local_34 + local_38 + (int)local_40 <= i_2) {
      return true;
    }
    if (7 < n[i_2]) break;
    i_2 = i_2 + 1;
  }
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }